

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getNodeSize(sqlite3 *db,Rtree *pRtree,int isCreate,char **pzErr)

{
  char *pcVar1;
  int local_3c;
  char *pcStack_38;
  int iPageSize;
  char *zSql;
  char **ppcStack_28;
  int rc;
  char **pzErr_local;
  Rtree *pRStack_18;
  int isCreate_local;
  Rtree *pRtree_local;
  sqlite3 *db_local;
  
  ppcStack_28 = pzErr;
  pzErr_local._4_4_ = isCreate;
  pRStack_18 = pRtree;
  pRtree_local = (Rtree *)db;
  if (isCreate == 0) {
    pcStack_38 = sqlite3_mprintf("SELECT length(data) FROM \'%q\'.\'%q_node\' WHERE nodeno = 1",
                                 pRtree->zDb,pRtree->zName);
    zSql._4_4_ = getIntFromStmt((sqlite3 *)pRtree_local,pcStack_38,&pRStack_18->iNodeSize);
    if (zSql._4_4_ == 0) {
      if (pRStack_18->iNodeSize < 0x1c0) {
        zSql._4_4_ = 0x10b;
        pcVar1 = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",pRStack_18->zName);
        *ppcStack_28 = pcVar1;
      }
    }
    else {
      pcVar1 = sqlite3_errmsg((sqlite3 *)pRtree_local);
      pcVar1 = sqlite3_mprintf("%s",pcVar1);
      *ppcStack_28 = pcVar1;
    }
  }
  else {
    local_3c = 0;
    pcStack_38 = sqlite3_mprintf("PRAGMA %Q.page_size",pRtree->zDb);
    zSql._4_4_ = getIntFromStmt((sqlite3 *)pRtree_local,pcStack_38,&local_3c);
    if (zSql._4_4_ == 0) {
      pRStack_18->iNodeSize = local_3c + -0x40;
      if ((int)((uint)pRStack_18->nBytesPerCell * 0x33 + 4) < pRStack_18->iNodeSize) {
        pRStack_18->iNodeSize = (uint)pRStack_18->nBytesPerCell * 0x33 + 4;
      }
    }
    else {
      pcVar1 = sqlite3_errmsg((sqlite3 *)pRtree_local);
      pcVar1 = sqlite3_mprintf("%s",pcVar1);
      *ppcStack_28 = pcVar1;
    }
  }
  sqlite3_free(pcStack_38);
  return zSql._4_4_;
}

Assistant:

static int getNodeSize(
  sqlite3 *db,                    /* Database handle */
  Rtree *pRtree,                  /* Rtree handle */
  int isCreate,                   /* True for xCreate, false for xConnect */
  char **pzErr                    /* OUT: Error message, if any */
){
  int rc;
  char *zSql;
  if( isCreate ){
    int iPageSize = 0;
    zSql = sqlite3_mprintf("PRAGMA %Q.page_size", pRtree->zDb);
    rc = getIntFromStmt(db, zSql, &iPageSize);
    if( rc==SQLITE_OK ){
      pRtree->iNodeSize = iPageSize-64;
      if( (4+pRtree->nBytesPerCell*RTREE_MAXCELLS)<pRtree->iNodeSize ){
        pRtree->iNodeSize = 4+pRtree->nBytesPerCell*RTREE_MAXCELLS;
      }
    }else{
      *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    }
  }else{
    zSql = sqlite3_mprintf(
        "SELECT length(data) FROM '%q'.'%q_node' WHERE nodeno = 1",
        pRtree->zDb, pRtree->zName
    );
    rc = getIntFromStmt(db, zSql, &pRtree->iNodeSize);
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    }else if( pRtree->iNodeSize<(512-64) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
      *pzErr = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",
                               pRtree->zName);
    }
  }

  sqlite3_free(zSql);
  return rc;
}